

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PStruct::ReadFields(PStruct *this,FArchive *ar,void *addr)

{
  PClass *pPVar1;
  byte bVar2;
  int iVar3;
  char *text;
  PSymbol *pPVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  bool bVar6;
  BYTE tag_1;
  BYTE tag;
  byte local_4a;
  byte local_49;
  undefined4 local_48;
  FName local_44;
  void *local_40;
  PSymbolTable *local_38;
  
  local_40 = addr;
  text = FArchive::ReadName(ar);
  if (text == (char *)0x0) {
    bVar2 = 1;
  }
  else {
    local_38 = &(this->super_PNamedType).super_PCompoundType.super_PType.Symbols;
    local_48 = 0;
    do {
      local_44.Index = FName::NameManager::FindName(&FName::NameData,text,true);
      pPVar4 = PSymbolTable::FindSymbol(local_38,&local_44,true);
      pPVar1 = PField::RegistrationInfo.MyClass;
      if (pPVar4 == (PSymbol *)0x0) {
        DPrintf(1,"Cannot find field %s in %s\n",text,
                FName::NameData.NameArray[(this->super_PNamedType).TypeName.Index].Text);
        FArchive::operator<<(ar,&local_4a);
        bVar2 = local_4a;
LAB_0049fbb5:
        PType::SkipValue(ar,(uint)bVar2);
      }
      else {
        if ((pPVar4->super_DObject).Class == (PClass *)0x0) {
          iVar3 = (**(pPVar4->super_DObject)._vptr_DObject)(pPVar4);
          (pPVar4->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar5 = (pPVar4->super_DObject).Class;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar1 && bVar6) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar6 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar1) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar6) {
          DPrintf(1,"Symbol %s in %s is not a field\n",text,
                  FName::NameData.NameArray[(this->super_PNamedType).TypeName.Index].Text);
          FArchive::operator<<(ar,&local_49);
          bVar2 = local_49;
          goto LAB_0049fbb5;
        }
        pPVar1 = pPVar4[1].super_DObject.Class;
        iVar3 = (*(pPVar1->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                  super_DObject._vptr_DObject[8])
                          (pPVar1,ar,
                           (ulong)*(uint *)&pPVar4[1].super_DObject._vptr_DObject + (long)local_40);
        local_48 = CONCAT31((int3)((uint)local_48 >> 8),(byte)local_48 | (byte)iVar3);
      }
      text = FArchive::ReadName(ar);
    } while (text != (char *)0x0);
    bVar2 = (byte)local_48;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool PStruct::ReadFields(FArchive &ar, void *addr) const
{
	bool readsomething = false;
	const char *label = ar.ReadName();
	if (label == NULL)
	{ // If there is nothing to restore, we count it as success.
		return true;
	}
	for (; label != NULL; label = ar.ReadName())
	{
		const PSymbol *sym = Symbols.FindSymbol(FName(label, true), true);
		if (sym == NULL)
		{
			DPrintf(DMSG_ERROR, "Cannot find field %s in %s\n",
				label, TypeName.GetChars());
			SkipValue(ar);
		}
		else if (!sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			DPrintf(DMSG_ERROR, "Symbol %s in %s is not a field\n",
				label, TypeName.GetChars());
			SkipValue(ar);
		}
		else
		{
			readsomething |= static_cast<const PField *>(sym)->Type->ReadValue(ar,
				(BYTE *)addr + static_cast<const PField *>(sym)->Offset);
		}
	}
	return readsomething;
}